

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modifiers.hpp
# Opt level: O3

values * __thiscall
pstore::command_line::
values<pstore::command_line::literal,pstore::command_line::literal,pstore::command_line::literal>
          (values *__return_storage_ptr__,command_line *this,literal *options,literal *options_1,
          literal *options_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  initializer_list<pstore::command_line::literal> options_00;
  literal local_f0;
  size_type *local_a8;
  size_type local_a0;
  size_type local_98;
  undefined8 uStack_90;
  int local_88;
  size_type *local_80;
  size_type local_78;
  size_type local_70;
  undefined8 uStack_68;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined8 uStack_48;
  int local_40;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  local_f0.name._M_dataplus._M_p = (pointer)&local_f0.name.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)this == paVar1) {
    local_f0.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.name.field_2._8_8_ = *(undefined8 *)(this + 0x18);
  }
  else {
    local_f0.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.name._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)this;
  }
  local_f0.name._M_string_length = *(size_type *)(this + 8);
  local_f0.description._M_dataplus._M_p = (pointer)&local_f0.description.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)this = paVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (command_line)0x0;
  local_f0.value = *(int *)(this + 0x20);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x38);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 0x28) == paVar1) {
    local_f0.description.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.description.field_2._8_8_ = *(undefined8 *)(this + 0x40);
  }
  else {
    local_f0.description.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.description._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 0x28);
  }
  local_f0.description._M_string_length = *(size_type *)(this + 0x30);
  local_a8 = &local_98;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 0x28) = paVar1;
  *(undefined8 *)(this + 0x30) = 0;
  this[0x38] = (command_line)0x0;
  psVar2 = (size_type *)(options->name)._M_dataplus._M_p;
  paVar1 = &(options->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar1) {
    local_98 = paVar1->_M_allocated_capacity;
    uStack_90 = *(undefined8 *)((long)&(options->name).field_2 + 8);
  }
  else {
    local_98 = paVar1->_M_allocated_capacity;
    local_a8 = psVar2;
  }
  local_a0 = (options->name)._M_string_length;
  local_80 = &local_70;
  (options->name)._M_dataplus._M_p = (pointer)paVar1;
  (options->name)._M_string_length = 0;
  (options->name).field_2._M_local_buf[0] = '\0';
  local_88 = options->value;
  psVar2 = (size_type *)(options->description)._M_dataplus._M_p;
  paVar1 = &(options->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar1) {
    local_70 = paVar1->_M_allocated_capacity;
    uStack_68 = *(undefined8 *)((long)&(options->description).field_2 + 8);
  }
  else {
    local_70 = paVar1->_M_allocated_capacity;
    local_80 = psVar2;
  }
  local_78 = (options->description)._M_string_length;
  local_60 = &local_50;
  (options->description)._M_dataplus._M_p = (pointer)paVar1;
  (options->description)._M_string_length = 0;
  (options->description).field_2._M_local_buf[0] = '\0';
  psVar2 = (size_type *)(options_1->name)._M_dataplus._M_p;
  paVar1 = &(options_1->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar1) {
    local_50 = paVar1->_M_allocated_capacity;
    uStack_48 = *(undefined8 *)((long)&(options_1->name).field_2 + 8);
  }
  else {
    local_50 = paVar1->_M_allocated_capacity;
    local_60 = psVar2;
  }
  local_58 = (options_1->name)._M_string_length;
  psVar2 = &local_28;
  (options_1->name)._M_dataplus._M_p = (pointer)paVar1;
  (options_1->name)._M_string_length = 0;
  (options_1->name).field_2._M_local_buf[0] = '\0';
  local_40 = options_1->value;
  local_38 = (size_type *)(options_1->description)._M_dataplus._M_p;
  paVar1 = &(options_1->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38 == paVar1) {
    local_28 = paVar1->_M_allocated_capacity;
    uStack_20 = *(undefined8 *)((long)&(options_1->description).field_2 + 8);
    local_38 = psVar2;
  }
  else {
    local_28 = paVar1->_M_allocated_capacity;
  }
  local_30 = (options_1->description)._M_string_length;
  (options_1->description)._M_dataplus._M_p = (pointer)paVar1;
  (options_1->description)._M_string_length = 0;
  (options_1->description).field_2._M_local_buf[0] = '\0';
  options_00._M_len = 3;
  options_00._M_array = &local_f0;
  details::values::values(__return_storage_ptr__,options_00);
  lVar3 = -0xd8;
  do {
    if (psVar2 != (size_type *)psVar2[-2]) {
      operator_delete((size_type *)psVar2[-2],*psVar2 + 1);
    }
    if (psVar2 + -5 != (size_type *)psVar2[-7]) {
      operator_delete((size_type *)psVar2[-7],psVar2[-5] + 1);
    }
    psVar2 = psVar2 + -9;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

details::values values (OptsTy &&... options) {
            return details::values{std::forward<OptsTy> (options)...};
        }